

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O2

void png_set_tRNS(png_structrp png_ptr,png_inforp info_ptr,png_const_bytep trans_alpha,int num_trans
                 ,png_const_color_16p trans_color)

{
  byte *pbVar1;
  ushort uVar2;
  undefined1 uVar3;
  png_uint_16 pVar4;
  png_uint_16 pVar5;
  png_uint_16 pVar6;
  uint uVar7;
  png_bytep __dest;
  
  if (info_ptr == (png_inforp)0x0 || png_ptr == (png_structrp)0x0) {
    return;
  }
  if (trans_alpha != (png_const_bytep)0x0) {
    png_free_data(png_ptr,info_ptr,0x2000,0);
    if (num_trans - 1U < 0x100) {
      __dest = (png_bytep)png_malloc(png_ptr,0x100);
      info_ptr->trans_alpha = __dest;
      memcpy(__dest,trans_alpha,(ulong)(uint)num_trans);
    }
    else {
      __dest = info_ptr->trans_alpha;
    }
    png_ptr->trans_alpha = __dest;
  }
  if (trans_color == (png_const_color_16p)0x0) {
    info_ptr->num_trans = (png_uint_16)num_trans;
    if (num_trans == 0) {
      return;
    }
    goto LAB_00129e48;
  }
  if (info_ptr->bit_depth < 0x10) {
    uVar7 = ~(-1 << (info_ptr->bit_depth & 0x1f));
    if (info_ptr->color_type == '\x02') {
      if ((trans_color->red <= uVar7) && (trans_color->green <= uVar7)) {
        uVar2 = trans_color->blue;
        goto LAB_00129df2;
      }
LAB_00129e16:
      png_warning(png_ptr,"tRNS chunk has out-of-range samples for bit_depth");
    }
    else if (info_ptr->color_type == '\0') {
      uVar2 = trans_color->gray;
LAB_00129df2:
      if (uVar7 < uVar2) goto LAB_00129e16;
    }
  }
  (info_ptr->trans_color).gray = trans_color->gray;
  uVar3 = trans_color->field_0x1;
  pVar4 = trans_color->red;
  pVar5 = trans_color->green;
  pVar6 = trans_color->blue;
  (info_ptr->trans_color).index = trans_color->index;
  (info_ptr->trans_color).field_0x1 = uVar3;
  (info_ptr->trans_color).red = pVar4;
  (info_ptr->trans_color).green = pVar5;
  (info_ptr->trans_color).blue = pVar6;
  info_ptr->num_trans = (png_uint_16)num_trans + (ushort)(num_trans == 0);
LAB_00129e48:
  *(byte *)&info_ptr->valid = (byte)info_ptr->valid | 0x10;
  pbVar1 = (byte *)((long)&info_ptr->free_me + 1);
  *pbVar1 = *pbVar1 | 0x20;
  return;
}

Assistant:

void PNGAPI
png_set_tRNS(png_structrp png_ptr, png_inforp info_ptr,
    png_const_bytep trans_alpha, int num_trans, png_const_color_16p trans_color)
{
   png_debug1(1, "in %s storage function", "tRNS");

   if (png_ptr == NULL || info_ptr == NULL)

      return;

   if (trans_alpha != NULL)
   {
       /* It may not actually be necessary to set png_ptr->trans_alpha here;
        * we do it for backward compatibility with the way the png_handle_tRNS
        * function used to do the allocation.
        *
        * 1.6.0: The above statement is incorrect; png_handle_tRNS effectively
        * relies on png_set_tRNS storing the information in png_struct
        * (otherwise it won't be there for the code in pngrtran.c).
        */

       png_free_data(png_ptr, info_ptr, PNG_FREE_TRNS, 0);

       if (num_trans > 0 && num_trans <= PNG_MAX_PALETTE_LENGTH)
       {
         /* Changed from num_trans to PNG_MAX_PALETTE_LENGTH in version 1.2.1 */
          info_ptr->trans_alpha = png_voidcast(png_bytep,
              png_malloc(png_ptr, PNG_MAX_PALETTE_LENGTH));
          memcpy(info_ptr->trans_alpha, trans_alpha, (size_t)num_trans);
       }
       png_ptr->trans_alpha = info_ptr->trans_alpha;
   }

   if (trans_color != NULL)
   {
#ifdef PNG_WARNINGS_SUPPORTED
      if (info_ptr->bit_depth < 16)
      {
         int sample_max = (1 << info_ptr->bit_depth) - 1;

         if ((info_ptr->color_type == PNG_COLOR_TYPE_GRAY &&
             trans_color->gray > sample_max) ||
             (info_ptr->color_type == PNG_COLOR_TYPE_RGB &&
             (trans_color->red > sample_max ||
             trans_color->green > sample_max ||
             trans_color->blue > sample_max)))
            png_warning(png_ptr,
                "tRNS chunk has out-of-range samples for bit_depth");
      }
#endif

      info_ptr->trans_color = *trans_color;

      if (num_trans == 0)
         num_trans = 1;
   }

   info_ptr->num_trans = (png_uint_16)num_trans;

   if (num_trans != 0)
   {
      info_ptr->valid |= PNG_INFO_tRNS;
      info_ptr->free_me |= PNG_FREE_TRNS;
   }
}